

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

double __thiscall mp::VarVecRecomp::operator[](VarVecRecomp *this,int i)

{
  size_type __n;
  double dVar1;
  reference rVar2;
  
  __n = (size_type)i;
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_recomp_,__n);
  if ((*rVar2._M_p & rVar2._M_mask) == 0) {
    dVar1 = std::function<double_(int,_const_mp::VarInfoRecomp_&)>::operator()
                      (&this->recomp_fn_,i,this->p_var_info_recomp_);
    (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[__n] = dVar1;
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_recomp_,__n);
    *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  }
  return (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[__n];
}

Assistant:

double operator[]( int i ) const {
    assert(i>=0 && i<(int)x_.size());
    assert(p_var_info_recomp_ != nullptr);
    if (!is_recomp_[i]) {
      x_[i] = recomp_fn_(i, *p_var_info_recomp_);
      is_recomp_[i] = true;
    }
    return x_[i];
  }